

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::Var::Var(Var *this,Generator *module,string *name,uint32_t var_width,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *size,bool is_signed)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  byte local_31;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_30;
  bool is_signed_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size_local;
  string *psStack_20;
  uint32_t var_width_local;
  string *name_local;
  Generator *module_local;
  Var *this_local;
  
  local_31 = is_signed;
  pvStack_30 = size;
  size_local._4_4_ = var_width;
  psStack_20 = name;
  name_local = (string *)module;
  module_local = (Generator *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,size);
  Var(this,module,name,var_width,&local_50,(bool)(local_31 & 1),Base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
  return;
}

Assistant:

Var::Var(Generator *module, const std::string &name, uint32_t var_width,
         const std::vector<uint32_t> &size, bool is_signed)
    : Var(module, name, var_width, size, is_signed, VarType::Base) {}